

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lemon.c
# Opt level: O3

char * append_str(char *zText,int n,int p1,int p2,int bNoSubst)

{
  int iVar1;
  size_t sVar2;
  ulong uVar3;
  char *pcVar4;
  long lVar5;
  char *pcVar6;
  int iVar7;
  uint uVar8;
  char zInt [40];
  char local_58 [40];
  
  pcVar4 = append_str::z;
  if (zText == (char *)0x0) {
    if (append_str::z != (char *)0x0 && append_str::used == 0) {
      *append_str::z = '\0';
    }
    append_str::used = 0;
  }
  else {
    sVar2 = (size_t)(uint)n;
    if (n < 1) {
      if ((n < 0) && (append_str::used = append_str::used + n, append_str::used < 0)) {
        __assert_fail("used>=0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/tools/lemon/lemon.c"
                      ,0xdc3,"char *append_str(const char *, int, int, int, int)");
      }
      sVar2 = strlen(zText);
    }
    lVar5 = (long)append_str::used;
    uVar3 = (int)sVar2 + lVar5 + 0x50;
    if ((ulong)(long)append_str::alloced <= uVar3) {
      append_str::alloced = (int)uVar3 + 200;
      append_str::z = (char *)realloc(append_str::z,(long)append_str::alloced);
    }
    if (append_str::z == (char *)0x0) {
      pcVar4 = append_str::empty;
    }
    else {
      pcVar4 = append_str::z;
      if (0 < (int)sVar2) {
        do {
          pcVar6 = zText + 1;
          iVar7 = (int)sVar2;
          if ((((iVar7 == 1) || (bNoSubst != 0)) || (*zText != '%')) || (*pcVar6 != 'd')) {
            uVar8 = iVar7 - 1;
            lVar5 = (long)append_str::used;
            append_str::used = append_str::used + 1;
            pcVar4[lVar5] = *zText;
          }
          else {
            sprintf(local_58,"%d",(ulong)(uint)p1);
            iVar1 = append_str::used;
            pcVar4 = append_str::z;
            pcVar6 = append_str::z + append_str::used;
            strcpy(pcVar6,local_58);
            sVar2 = strlen(pcVar6);
            append_str::used = (int)sVar2 + iVar1;
            pcVar6 = zText + 2;
            uVar8 = iVar7 - 2;
            p1 = p2;
          }
          sVar2 = (size_t)uVar8;
          zText = pcVar6;
        } while (0 < (int)uVar8);
        lVar5 = (long)append_str::used;
      }
      pcVar4[lVar5] = '\0';
    }
  }
  return pcVar4;
}

Assistant:

PRIVATE char *append_str(const char *zText, int n, int p1, int p2, int bNoSubst){
  static char empty[1] = { 0 };
  static char *z = 0;
  static int alloced = 0;
  static int used = 0;
  int c;
  char zInt[40];
  if( zText==0 ){
    if( used==0 && z!=0 ) z[0] = 0;
    used = 0;
    return z;
  }
  if( n<=0 ){
    if( n<0 ){
      used += n;
      assert( used>=0 );
    }
    n = lemonStrlen(zText);
  }
  if( n+sizeof(zInt)*2+used >= (size_t)alloced ){
    alloced = n + sizeof(zInt)*2 + used + 200;
    z = (char *) realloc(z,  alloced);
  }
  if( z==0 ) return empty;
  while( n-- > 0 ){
    c = *(zText++);
    if( !bNoSubst && c=='%' && n>0 && zText[0]=='d' ){
      sprintf(zInt, "%d", p1);
      p1 = p2;
      strcpy(&z[used], zInt);
      used += lemonStrlen(&z[used]);
      zText++;
      n--;
    }else{
      z[used++] = c;
    }
  }
  z[used] = 0;
  return z;
}